

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O0

ssl_verify_result_t bssl::ssl_reverify_peer_cert(SSL_HANDSHAKE *hs,bool send_alert)

{
  bool bVar1;
  ssl_verify_result_t local_28;
  byte local_21;
  ssl_verify_result_t ret;
  uint8_t alert;
  SSL *ssl;
  SSL_HANDSHAKE *pSStack_10;
  bool send_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  _ret = hs->ssl;
  ssl._7_1_ = send_alert;
  pSStack_10 = hs;
  bVar1 = std::operator==(&_ret->s3->established_session,(nullptr_t)0x0);
  if (!bVar1) {
    __assert_fail("ssl->s3->established_session == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                  ,0x149,
                  "enum ssl_verify_result_t bssl::ssl_reverify_peer_cert(SSL_HANDSHAKE *, bool)");
  }
  if (pSStack_10->config->verify_mode == '\0') {
    __assert_fail("hs->config->verify_mode != SSL_VERIFY_NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                  ,0x14a,
                  "enum ssl_verify_result_t bssl::ssl_reverify_peer_cert(SSL_HANDSHAKE *, bool)");
  }
  local_21 = 0x2e;
  local_28 = ssl_verify_invalid;
  if (pSStack_10->config->custom_verify_callback !=
      (_func_ssl_verify_result_t_SSL_ptr_uint8_t_ptr *)0x0) {
    local_28 = (*pSStack_10->config->custom_verify_callback)(_ret,&local_21);
  }
  if ((local_28 == ssl_verify_invalid) &&
     (ERR_put_error(0x10,0,0x7d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0x153), (ssl._7_1_ & 1) != 0)) {
    ssl_send_alert(_ret,2,(uint)local_21);
  }
  return local_28;
}

Assistant:

enum ssl_verify_result_t ssl_reverify_peer_cert(SSL_HANDSHAKE *hs,
                                                bool send_alert) {
  SSL *const ssl = hs->ssl;
  assert(ssl->s3->established_session == nullptr);
  assert(hs->config->verify_mode != SSL_VERIFY_NONE);

  uint8_t alert = SSL_AD_CERTIFICATE_UNKNOWN;
  enum ssl_verify_result_t ret = ssl_verify_invalid;
  if (hs->config->custom_verify_callback != nullptr) {
    ret = hs->config->custom_verify_callback(ssl, &alert);
  }

  if (ret == ssl_verify_invalid) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CERTIFICATE_VERIFY_FAILED);
    if (send_alert) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    }
  }

  return ret;
}